

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

int Abc_SopGetPhase(char *pSop)

{
  char cVar1;
  int iVar2;
  
  iVar2 = Abc_SopGetVarNum(pSop);
  cVar1 = pSop[(long)iVar2 + 1];
  iVar2 = 0;
  if (cVar1 != '0') {
    if (cVar1 != 'x') {
      if (cVar1 == 'n') {
        return 0;
      }
      if (cVar1 != '1') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcSop.c"
                      ,0x233,"int Abc_SopGetPhase(char *)");
      }
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Abc_SopGetPhase( char * pSop )
{
    int nVars = Abc_SopGetVarNum( pSop );
    if ( pSop[nVars+1] == '0' || pSop[nVars+1] == 'n' )
        return 0;
    if ( pSop[nVars+1] == '1' || pSop[nVars+1] == 'x' )
        return 1;
    assert( 0 );
    return -1;
}